

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O3

int Omega_h::any::vtable_dynamic<Omega_h::NameValue>::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long *plVar1;
  long lVar2;
  string *psVar3;
  
  psVar3 = (string *)operator_new(0x30);
  plVar1 = *(long **)dst;
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,*plVar1,plVar1[1] + *plVar1);
  *(long *)(psVar3 + 0x20) = plVar1[4];
  lVar2 = plVar1[5];
  *(long *)(psVar3 + 0x28) = lVar2;
  if (lVar2 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    }
  }
  *(string **)src = psVar3;
  return (int)lVar2;
}

Assistant:

static void copy(const storage_union& src, storage_union& dest) {
      dest.dynamic = new T(*reinterpret_cast<const T*>(src.dynamic));
    }